

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDec.c
# Opt level: O1

void Lpk_DecomposeClean(Vec_Ptr_t *vLeaves,int nLeavesOld)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)nLeavesOld;
  iVar1 = vLeaves->nSize;
  if (nLeavesOld < iVar1) {
    do {
      if (nLeavesOld < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Lpk_FunFree((Lpk_Fun_t *)vLeaves->pArray[uVar2]);
      uVar2 = uVar2 + 1;
      iVar1 = vLeaves->nSize;
    } while ((int)uVar2 < iVar1);
  }
  if (iVar1 < nLeavesOld) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
  }
  vLeaves->nSize = nLeavesOld;
  return;
}

Assistant:

void Lpk_DecomposeClean( Vec_Ptr_t * vLeaves, int nLeavesOld )
{
    Lpk_Fun_t * pFunc;
    int i;
    Vec_PtrForEachEntryStart( Lpk_Fun_t *, vLeaves, pFunc, i, nLeavesOld )
        Lpk_FunFree( pFunc );
    Vec_PtrShrink( vLeaves, nLeavesOld );
}